

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_SimpleArray<ON_3fPoint> * __thiscall
ON_3dPointListRef::To3fPointArray
          (ON_SimpleArray<ON_3fPoint> *__return_storage_ptr__,ON_3dPointListRef *this)

{
  double *pdVar1;
  float *local_48;
  float *src_1;
  double *src;
  float *dst;
  uint local_20;
  uint i;
  ON_3dPointListRef *this_local;
  ON_SimpleArray<ON_3fPoint> *a;
  
  ON_SimpleArray<ON_3fPoint>::ON_SimpleArray(__return_storage_ptr__);
  local_20 = this->m_point_count;
  if (local_20 != 0) {
    ON_SimpleArray<ON_3fPoint>::Reserve(__return_storage_ptr__,(ulong)local_20);
    ON_SimpleArray<ON_3fPoint>::SetCount(__return_storage_ptr__,local_20);
    src = (double *)ON_SimpleArray<ON_3fPoint>::Array(__return_storage_ptr__);
    if (this->m_dP == (double *)0x0) {
      if (this->m_fP != (float *)0x0) {
        local_48 = this->m_fP;
        while (local_20 != 0) {
          *(float *)src = *local_48;
          pdVar1 = src + 1;
          *(float *)((long)src + 4) = local_48[1];
          src = (double *)((long)src + 0xc);
          *(float *)pdVar1 = local_48[2];
          local_48 = local_48 + this->m_point_stride;
          local_20 = local_20 - 1;
        }
      }
    }
    else {
      src_1 = (float *)this->m_dP;
      while (local_20 != 0) {
        *(float *)src = (float)*(double *)src_1;
        pdVar1 = src + 1;
        *(float *)((long)src + 4) = (float)*(double *)(src_1 + 2);
        src = (double *)((long)src + 0xc);
        *(float *)pdVar1 = (float)*(double *)(src_1 + 4);
        src_1 = src_1 + (ulong)this->m_point_stride * 2;
        local_20 = local_20 - 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SimpleArray<ON_3fPoint> ON_3dPointListRef::To3fPointArray() const
{
  ON_SimpleArray<ON_3fPoint> a;

  unsigned int i = m_point_count;
  if ( i > 0 )
  {
    a.Reserve(i);
    a.SetCount(i);
    float* dst = (float*)a.Array();
    if ( m_dP )
    {
      const double* src = m_dP;
      while(i--)
      {
        *dst++ = (float)src[0];
        *dst++ = (float)src[1];
        *dst++ = (float)src[2];
        src += m_point_stride;
      }
    }
    else if ( m_fP )
    {
      const float* src = m_fP;
      while(i--)
      {
        *dst++ = src[0];
        *dst++ = src[1];
        *dst++ = src[2];
        src += m_point_stride;
      }
    }
  }

  // Note: 
  //  ON_SimpleArray<ON_3fPoint> has rvalue copy constructor
  //  and operator=, so this return does not create a copy.
  return a;
}